

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O1

uintptr_t ptrie_lookup(PTrie *ptrie,uintptr_t key)

{
  PTrieNode *pPVar1;
  PTrieNode *pPVar2;
  uintptr_t *puVar3;
  bool bVar4;
  
  LOCK();
  UNLOCK();
  if (largeAllocSizes.lock != 0) {
    do {
    } while( true );
  }
  largeAllocSizes.lock = 1;
  pPVar2 = largeAllocSizes.root;
  if (((ulong)largeAllocSizes.root & 1) == 0) {
    do {
      pPVar1 = pPVar2;
      bVar4 = ((ulong)ptrie >> ((ulong)(uint)pPVar1->keys[0] & 0x3f) & 1) != 0;
      pPVar2 = pPVar1->childNodes[bVar4];
    } while (((ulong)pPVar2 & 1) == 0);
    puVar3 = pPVar1->keys + bVar4;
  }
  else {
    puVar3 = (uintptr_t *)0x0;
  }
  if ((puVar3 != (uintptr_t *)0x0) && ((PTrie *)(*puVar3 & 0xffffffffffffff00) == ptrie)) {
    largeAllocSizes.lock = 0;
    return (ulong)pPVar2 & 0xfffffffffffffffe;
  }
  __assert_fail("lastKey && (*lastKey & ~0xFF) == key",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                ,0x203,"uintptr_t ptrie_lookup(PTrie *, uintptr_t)");
}

Assistant:

static uintptr_t ptrie_lookup(PTrie* ptrie, uintptr_t key)
{
	SPINLOCK_ACQUIRE(&ptrie->lock);
	PTrieNode* node = ptrie->root;
	uintptr_t* lastKey = NULL;
	while (!((uintptr_t)node & 1))
	{
		int branch = (key >> (node->keys[0] & 0xFF)) & 1;
		lastKey = &node->keys[branch];
		node = node->childNodes[branch];
	}
	LTALLOC_ASSERT(lastKey && (*lastKey & ~0xFF) == key);
	SPINLOCK_RELEASE(&ptrie->lock);
	return (uintptr_t)node & ~1;
}